

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O0

RangeValue __thiscall CoreML::RangeValue::divideAndRoundUp(RangeValue *this,size_t other)

{
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 uVar1;
  RangeValue RVar2;
  size_t other_local;
  RangeValue *this_local;
  size_t local_10;
  
  if (((this->_isUnbound & 1U) == 0) && (other != 0)) {
    if (this->_val == 0) {
      RangeValue((RangeValue *)&this_local,0);
      uVar1 = extraout_RAX_00;
    }
    else {
      RangeValue((RangeValue *)&this_local,(this->_val - 1) / other + 1);
      uVar1 = extraout_RAX_01;
    }
  }
  else {
    RangeValue((RangeValue *)&this_local);
    uVar1 = extraout_RAX;
  }
  RVar2._1_7_ = (undefined7)((ulong)uVar1 >> 8);
  RVar2._isUnbound = (bool)this_local._0_1_;
  RVar2._val = local_10;
  return RVar2;
}

Assistant:

RangeValue RangeValue::divideAndRoundUp(size_t other) const {
    if (_isUnbound || other == 0) {
        return RangeValue();
    }
    else if (_val == 0) {
        return RangeValue(0);
    }
    else {
        return ((_val - 1) / other) + 1;
    }
}